

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnSimdShuffleOpExpr
          (BinaryReaderInterp *this,Opcode opcode,v128 value)

{
  Istream *this_00;
  v128 val;
  v128 value_00;
  bool bVar1;
  Enum op;
  Result RVar2;
  Location local_50;
  Enum local_2c;
  BinaryReaderInterp *local_28;
  BinaryReaderInterp *this_local;
  v128 value_local;
  Opcode opcode_local;
  
  value_local.v._0_8_ = value.v._8_8_;
  this_local = value.v._0_8_;
  local_28 = this;
  value_local.v._8_4_ = opcode.enum_;
  GetLocation(&local_50,this);
  value_00.v[8] = value_local.v[0];
  value_00.v[9] = value_local.v[1];
  value_00.v[10] = value_local.v[2];
  value_00.v[0xb] = value_local.v[3];
  value_00.v[0xc] = value_local.v[4];
  value_00.v[0xd] = value_local.v[5];
  value_00.v[0xe] = value_local.v[6];
  value_00.v[0xf] = value_local.v[7];
  value_00.v._0_8_ = this_local;
  local_2c = (Enum)SharedValidator::OnSimdShuffleOp
                             (&this->validator_,&local_50,(Opcode)value_local.v._8_4_,value_00);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)(value_local.v + 0xc),Error);
  }
  else {
    this_00 = this->istream_;
    op = Opcode::operator_cast_to_Enum((Opcode *)(value_local.v + 8));
    val.v[8] = value_local.v[0];
    val.v[9] = value_local.v[1];
    val.v[10] = value_local.v[2];
    val.v[0xb] = value_local.v[3];
    val.v[0xc] = value_local.v[4];
    val.v[0xd] = value_local.v[5];
    val.v[0xe] = value_local.v[6];
    val.v[0xf] = value_local.v[7];
    val.v._0_8_ = this_local;
    Istream::Emit(this_00,op,val);
    Result::Result((Result *)(value_local.v + 0xc),Ok);
  }
  RVar2.enum_._0_1_ = value_local.v[0xc];
  RVar2.enum_._1_1_ = value_local.v[0xd];
  RVar2.enum_._2_1_ = value_local.v[0xe];
  RVar2.enum_._3_1_ = value_local.v[0xf];
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderInterp::OnSimdShuffleOpExpr(Opcode opcode, v128 value) {
  CHECK_RESULT(validator_.OnSimdShuffleOp(GetLocation(), opcode, value));
  istream_.Emit(opcode, value);
  return Result::Ok;
}